

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcControl *this;
  
  this = (IfcControl *)operator_new(0x128);
  *(undefined ***)&this[1].super_IfcObject.field_0x18 = &PTR__Object_00816a50;
  *(undefined8 *)&this[1].super_IfcObject.field_0x20 = 0;
  *(char **)&this[1].super_IfcObject.field_0x28 = "IfcPerformanceHistory";
  Assimp::IFC::Schema_2x3::IfcControl::IfcControl(this,&PTR_construction_vtable_24__0081e980);
  *(undefined8 *)&this->field_0xe8 = 0;
  *(undefined ***)&this->super_IfcObject = &PTR__IfcPerformanceHistory_0081e8a0;
  *(undefined ***)&this[1].super_IfcObject.field_0x18 = &PTR__IfcPerformanceHistory_0081e968;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcPerformanceHistory_0081e8c8;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPerformanceHistory_0081e8f0;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcPerformanceHistory_0081e918;
  *(undefined ***)&(this->super_IfcObject).field_0xe0 = &PTR__IfcPerformanceHistory_0081e940;
  *(undefined1 **)&this->field_0xf0 = &this[1].super_IfcObject.field_0x8;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  this[1].super_IfcObject.field_0x8 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObject>(db,params,(IfcObject *)this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }